

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileParser::getHomogeneousVector3
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  char *pBuffer;
  pointer *ppaVar1;
  iterator __position;
  byte *pbVar2;
  byte *pbVar3;
  float fVar4;
  byte *pbVar5;
  runtime_error *this_00;
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  ai_real ret;
  aiVector3t<float> local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pBuffer = this->m_buffer;
  copyNextWord(this,pBuffer,0x1000);
  local_68.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_68.x,true);
  local_38 = ZEXT416((uint)local_68.x);
  copyNextWord(this,pBuffer,0x1000);
  local_68.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_68.x,true);
  local_48 = ZEXT416((uint)local_68.x);
  copyNextWord(this,pBuffer,0x1000);
  local_68.x = 0.0;
  fast_atoreal_move<float>(pBuffer,&local_68.x,true);
  fVar4 = local_68.x;
  copyNextWord(this,pBuffer,0x1000);
  local_68._0_8_ = (ulong)(uint)local_68.y << 0x20;
  fast_atoreal_move<float>(pBuffer,&local_68.x,true);
  if ((local_68.x == 0.0) && (!NAN(local_68.x))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._0_8_ = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"OBJ: Invalid component in homogeneous vector (Division by zero)"
               ,"");
    std::runtime_error::runtime_error(this_00,(string *)&local_68);
    *(undefined ***)this_00 = &PTR__runtime_error_007da4b8;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  auVar7._0_8_ = local_38._0_8_;
  auVar7._12_4_ = local_38._12_4_;
  auVar7._8_4_ = local_38._4_4_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._0_4_ = local_38._0_4_;
  auVar6._4_4_ = local_48._0_4_;
  auVar8._0_12_ = auVar6._0_12_;
  auVar8._12_4_ = local_48._4_4_;
  local_68.z = fVar4 / local_68.x;
  auVar9._4_4_ = local_68.x;
  auVar9._0_4_ = local_68.x;
  auVar9._8_8_ = 0;
  auVar9 = divps(auVar8,auVar9);
  local_68._0_8_ = auVar9._0_8_;
  __position._M_current =
       (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (point3d_array->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array,
               __position,&local_68);
  }
  else {
    (__position._M_current)->z = local_68.z;
    (__position._M_current)->x = local_68.x;
    (__position._M_current)->y = local_68.y;
    ppaVar1 = &(point3d_array->
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  pbVar5 = (byte *)(this->m_DataIt)._M_current;
  pbVar2 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar2 + -1 != pbVar5 && pbVar5 != pbVar2) {
    do {
      if (((*pbVar5 < 0xe) && ((0x3401U >> (*pbVar5 & 0x1f) & 1) != 0)) ||
         (pbVar5 = pbVar5 + 1, pbVar5 == pbVar2)) break;
    } while (pbVar5 != pbVar2 + -1);
  }
  pbVar3 = pbVar5;
  if (pbVar5 != pbVar2) {
    pbVar5 = pbVar5 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar3 = pbVar5;
  }
  for (; (pbVar3 != pbVar2 && ((*pbVar3 == 0x20 || (pbVar5 = pbVar3, *pbVar3 == 9))));
      pbVar3 = pbVar3 + 1) {
    pbVar5 = pbVar2;
  }
  (this->m_DataIt)._M_current = (char *)pbVar5;
  return;
}

Assistant:

void ObjFileParser::getHomogeneousVector3( std::vector<aiVector3D> &point3d_array ) {
    ai_real x, y, z, w;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    copyNextWord( m_buffer, Buffersize );
    z = ( ai_real ) fast_atof( m_buffer );

    copyNextWord( m_buffer, Buffersize );
    w = ( ai_real ) fast_atof( m_buffer );

    if (w == 0)
      throw DeadlyImportError("OBJ: Invalid component in homogeneous vector (Division by zero)");

    point3d_array.push_back( aiVector3D( x/w, y/w, z/w ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}